

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_log(int level,char *file,int line,char *fmt,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_168 [32];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  Callback *local_b0;
  Callback *cb;
  undefined1 local_a0 [4];
  int i;
  log_Event ev;
  char *fmt_local;
  int line_local;
  char *file_local;
  int level_local;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_148 = in_R8;
  local_140 = in_R9;
  ev._112_8_ = fmt;
  memset(local_a0,0,0x78);
  ev.ap[0].reg_save_area = (void *)ev._112_8_;
  ev.fmt = file;
  ev.udata._0_4_ = line;
  ev.udata._4_4_ = level;
  lock();
  if (((L.quiet & 1U) == 0) && (L.level <= level)) {
    init_event((log_Event *)local_a0,_stderr);
    ev.ap[0].overflow_arg_area = local_168;
    ev.ap[0]._0_8_ = &stack0x00000008;
    i = 0x30;
    local_a0 = (undefined1  [4])0x20;
    stdout_callback((log_Event *)local_a0);
  }
  cb._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (cb._4_4_ < 0x20) {
      bVar2 = L.callbacks[cb._4_4_].fn != (log_LogFn)0x0;
    }
    if (!bVar2) break;
    lVar1 = (long)cb._4_4_;
    local_b0 = L.callbacks + lVar1;
    if (L.callbacks[lVar1].level <= level) {
      init_event((log_Event *)local_a0,L.callbacks[lVar1].udata);
      ev.ap[0].overflow_arg_area = local_168;
      ev.ap[0]._0_8_ = &stack0x00000008;
      i = 0x30;
      local_a0 = (undefined1  [4])0x20;
      (*local_b0->fn)((log_Event *)local_a0);
    }
    cb._4_4_ = cb._4_4_ + 1;
  }
  unlock();
  return;
}

Assistant:

void log_log(int level, const char *file, int line, const char *fmt, ...) {
    log_Event ev = {
        .fmt = fmt,
        .file = file,
        .line = line,
        .level = level,
    };

    lock();

    if (!L.quiet && level >= L.level) {
        init_event(&ev, stderr);
        va_start(ev.ap, fmt);
        stdout_callback(&ev);
        va_end(ev.ap);
    }

    for (int i = 0; i < MAX_CALLBACKS && L.callbacks[i].fn; i++) {
        Callback *cb = &L.callbacks[i];
        if (level >= cb->level) {
            init_event(&ev, cb->udata);
            va_start(ev.ap, fmt);
            cb->fn(&ev);
            va_end(ev.ap);
        }
    }

    unlock();
}